

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O1

void __thiscall
duckdb::Blob::FromBase64(Blob *this,string_t str,data_ptr_t output,idx_t output_size)

{
  uint32_t uVar1;
  long lVar2;
  idx_t base_idx;
  long lVar3;
  data_ptr_t pdVar4;
  idx_t base_idx_00;
  ulong uVar5;
  char *input_data;
  anon_union_16_2_67f50693_for_value local_40;
  
  lVar2 = str.value._8_8_;
  local_40.pointer.ptr = (char *)str.value._0_8_;
  input_data = local_40.pointer.ptr;
  if (((ulong)this & 0xffffffff) < 0xd) {
    input_data = local_40.pointer.prefix;
  }
  if (((ulong)this & 0xffffffff) != 0) {
    local_40._0_8_ = this;
    if ((uint)this < 5) {
      base_idx = 0;
      lVar3 = 0;
    }
    else {
      lVar3 = 0;
      base_idx_00 = 0;
      do {
        uVar1 = DecodeBase64Bytes<false>
                          ((string_t *)&local_40.pointer,(const_data_ptr_t)input_data,base_idx_00);
        *(char *)(lVar2 + lVar3) = (char)(uVar1 >> 0x10);
        *(char *)(lVar2 + 1 + lVar3) = (char)(uVar1 >> 8);
        *(char *)(lVar2 + 2 + lVar3) = (char)uVar1;
        lVar3 = lVar3 + 3;
        base_idx = base_idx_00 + 4;
        uVar5 = base_idx_00 + 8;
        base_idx_00 = base_idx;
      } while (uVar5 < ((ulong)this & 0xffffffff));
    }
    uVar1 = DecodeBase64Bytes<true>
                      ((string_t *)&local_40.pointer,(const_data_ptr_t)input_data,base_idx);
    pdVar4 = (data_ptr_t)(lVar3 + 1);
    *(char *)(lVar2 + lVar3) = (char)(uVar1 >> 0x10);
    if (pdVar4 < output) {
      *(char *)(lVar2 + 1 + lVar3) = (char)(uVar1 >> 8);
      pdVar4 = (data_ptr_t)(lVar3 + 2);
    }
    if (pdVar4 < output) {
      pdVar4[lVar2] = (data_t)uVar1;
    }
  }
  return;
}

Assistant:

void Blob::FromBase64(string_t str, data_ptr_t output, idx_t output_size) {
	D_ASSERT(output_size == FromBase64Size(str));
	auto input_data = const_data_ptr_cast(str.GetData());
	auto input_size = str.GetSize();
	if (input_size == 0) {
		return;
	}
	idx_t out_idx = 0;
	idx_t i = 0;
	for (i = 0; i + 4 < input_size; i += 4) {
		auto combined = DecodeBase64Bytes<false>(str, input_data, i);
		output[out_idx++] = (combined >> 2 * 8) & 0xFF;
		output[out_idx++] = (combined >> 1 * 8) & 0xFF;
		output[out_idx++] = (combined >> 0 * 8) & 0xFF;
	}
	// decode the final four bytes: padding is allowed here
	auto combined = DecodeBase64Bytes<true>(str, input_data, i);
	output[out_idx++] = (combined >> 2 * 8) & 0xFF;
	if (out_idx < output_size) {
		output[out_idx++] = (combined >> 1 * 8) & 0xFF;
	}
	if (out_idx < output_size) {
		output[out_idx++] = (combined >> 0 * 8) & 0xFF;
	}
}